

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_compressBlock_internal
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  ulong *puVar1;
  ZSTD_matchState_t *ms;
  seqStore_t *seqStore;
  FSE_CTable *pFVar2;
  ZSTD_fseCTables_t *pZVar3;
  byte bVar4;
  byte bVar5;
  U32 UVar6;
  ZSTD_strategy ZVar7;
  HUF_repeat HVar8;
  ZSTD_compressedBlockState_t *pZVar9;
  BYTE *pBVar10;
  seqDef *psVar11;
  seqDef *psVar12;
  BYTE *pBVar13;
  symbolEncodingType_e sVar14;
  size_t __n;
  ulong uVar15;
  long lVar16;
  ulong *dst_00;
  ZSTD_compressedBlockState_t *pZVar17;
  byte bVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  uint symbol;
  U32 *pUVar22;
  uint uVar23;
  BYTE *pBVar24;
  ulong uVar25;
  ulong *puVar26;
  ulong *puVar27;
  uint uVar28;
  uint uVar29;
  long lVar30;
  size_t sVar31;
  ulong *puVar32;
  rawSeqStore_t *rawSeqStore;
  BYTE *istart;
  FSE_CTable *prevCTable;
  ulong uVar33;
  byte *pbVar34;
  byte *pbVar35;
  bool bVar36;
  size_t sVar37;
  uint max;
  undefined4 uStack_1c4;
  uint local_1c0;
  ulong *local_1b8;
  ulong *local_1b0;
  ulong *local_1a8;
  FSE_CTable *local_1a0;
  BYTE *local_198;
  symbolEncodingType_e local_190;
  uint local_18c;
  ZSTD_fseCTables_t *local_188;
  BYTE *local_180;
  BYTE *local_178;
  ZSTD_fseCTables_t *local_170;
  FSE_CState_t local_168;
  FSE_CState_t stateOffsetBits;
  FSE_CState_t stateMatchLength;
  uint count [53];
  
  if (srcSize < 7) {
    ZSTD_ldm_skipSequences(&zc->externSeqStore,srcSize,(zc->appliedParams).cParams.minMatch);
  }
  else {
    (zc->seqStore).lit = (zc->seqStore).litStart;
    (zc->seqStore).sequences = (zc->seqStore).sequencesStart;
    (zc->seqStore).longLengthID = 0;
    pZVar9 = (zc->blockState).prevCBlock;
    (zc->blockState).matchState.opt.symbolCosts = &pZVar9->entropy;
    uVar19 = (int)src - *(int *)&(zc->blockState).matchState.window.base;
    UVar6 = (zc->blockState).matchState.nextToUpdate;
    if (UVar6 + 0x180 < uVar19) {
      uVar28 = (uVar19 - UVar6) - 0x180;
      if (0xbf < uVar28) {
        uVar28 = 0xc0;
      }
      (zc->blockState).matchState.nextToUpdate = uVar19 - uVar28;
    }
    if ((zc->blockState).matchState.window.lowLimit < (zc->blockState).matchState.window.dictLimit)
    {
      uVar25 = 1;
    }
    else {
      uVar25 = (ulong)((uint)((zc->blockState).matchState.dictMatchState != (ZSTD_matchState_t *)0x0
                             ) * 2);
    }
    ms = &(zc->blockState).matchState;
    seqStore = &zc->seqStore;
    pUVar22 = ((zc->blockState).nextCBlock)->rep;
    for (lVar30 = 0; lVar30 != 3; lVar30 = lVar30 + 1) {
      pUVar22[lVar30] = pZVar9->rep[lVar30];
    }
    if ((zc->externSeqStore).pos < (zc->externSeqStore).size) {
      rawSeqStore = &zc->externSeqStore;
LAB_0037833c:
      __n = ZSTD_ldm_blockCompress(rawSeqStore,ms,seqStore,pUVar22,src,srcSize);
    }
    else {
      if ((zc->appliedParams).ldmParams.enableLdm != 0) {
        count[2] = 0;
        count[3] = 0;
        count[4] = 0;
        count[5] = 0;
        count._0_8_ = zc->ldmSequences;
        count._24_8_ = zc->maxNbLdmSequences;
        sVar31 = ZSTD_ldm_generateSequences
                           (&zc->ldmState,(rawSeqStore_t *)count,&(zc->appliedParams).ldmParams,src,
                            srcSize);
        if (0xffffffffffffff88 < sVar31) {
          return sVar31;
        }
        pUVar22 = ((zc->blockState).nextCBlock)->rep;
        rawSeqStore = (rawSeqStore_t *)count;
        goto LAB_0037833c;
      }
      __n = (*ZSTD_selectBlockCompressor::blockCompressor[uVar25]
              [(int)(zc->appliedParams).cParams.strategy])(ms,seqStore,pUVar22,src,srcSize);
    }
    memcpy((zc->seqStore).lit,(void *)((long)src + (srcSize - __n)),__n);
    pBVar24 = (zc->seqStore).lit + __n;
    (zc->seqStore).lit = pBVar24;
    pZVar9 = (zc->blockState).prevCBlock;
    pZVar17 = (zc->blockState).nextCBlock;
    ZVar7 = (zc->appliedParams).cParams.strategy;
    pBVar10 = (zc->seqStore).litStart;
    uVar25 = (long)pBVar24 - (long)pBVar10;
    bVar36 = true;
    if (ZVar7 == ZSTD_fast) {
      bVar36 = (zc->appliedParams).cParams.targetLength == 0;
    }
    psVar11 = (zc->seqStore).sequencesStart;
    psVar12 = (zc->seqStore).sequences;
    pUVar22 = zc->entropyWorkspace;
    local_1a0 = (FSE_CTable *)(ulong)(uint)zc->bmi2;
    local_18c = (zc->appliedParams).cParams.windowLog;
    local_198 = (zc->seqStore).ofCode;
    bVar18 = (char)ZVar7 - 1;
    if (ZVar7 < ZSTD_btultra) {
      bVar18 = 6;
    }
    local_178 = (zc->seqStore).llCode;
    local_180 = (zc->seqStore).mlCode;
    memcpy(pZVar17,pZVar9,0x404);
    if (bVar36) {
      HVar8 = (pZVar9->entropy).huf.repeatMode;
      uVar33 = 0x3f;
      if (HVar8 == HUF_repeat_valid) {
        uVar33 = 6;
      }
      if (uVar25 <= uVar33) goto LAB_00378563;
      uVar33 = ((ulong)(0x3ff < uVar25) - (ulong)(uVar25 < 0x4000)) + 4;
      sVar31 = dstCapacity - uVar33;
      if (uVar33 <= dstCapacity && sVar31 != 0) {
        _max = CONCAT44(uStack_1c4,HVar8);
        bVar36 = uVar25 < 0x401 && ZVar7 < ZSTD_lazy;
        local_188 = (ZSTD_fseCTables_t *)
                    CONCAT71(local_188._1_7_,
                             uVar33 == 3 && HVar8 == HUF_repeat_valid || uVar25 < 0x100);
        if (uVar33 == 3 && HVar8 == HUF_repeat_valid || uVar25 < 0x100) {
          uVar15 = HUF_compress1X_repeat
                             ((void *)((long)dst + uVar33),sVar31,pBVar10,uVar25,0xff,0xb,pUVar22,
                              0x1800,(HUF_CElt *)pZVar17,&max,(uint)bVar36,(int)local_1a0);
        }
        else {
          uVar15 = HUF_compress4X_repeat
                             ((void *)((long)dst + uVar33),sVar31,pBVar10,uVar25,0xff,0xb,pUVar22,
                              0x1800,(HUF_CElt *)pZVar17,&max,(uint)bVar36,(int)local_1a0);
        }
        uVar19 = 3 - (max == 0);
        if ((uVar25 - (uVar25 >> (bVar18 & 0x3f))) - 2 <= uVar15 || 0xffffffffffffff87 < uVar15 - 1)
        {
          memcpy(pZVar17,pZVar9,0x404);
          pbVar34 = (byte *)ZSTD_noCompressLiterals(dst,dstCapacity,pBVar10,uVar25);
          goto LAB_0037858a;
        }
        iVar21 = (int)uVar25;
        if (uVar15 != 1) {
          if (max == 0) {
            (pZVar17->entropy).huf.repeatMode = HUF_repeat_check;
          }
          iVar20 = (int)uVar15;
          if (uVar33 == 5) {
            *(uint *)dst = iVar20 * 0x400000 + iVar21 * 0x10 | uVar19 | 0xc;
            *(char *)((long)dst + 4) = (char)(uVar15 >> 10);
          }
          else if (uVar33 == 4) {
            *(uint *)dst = iVar20 * 0x40000 + iVar21 * 0x10 | uVar19 | 8;
          }
          else {
            iVar21 = iVar20 * 0x4000 + ((uVar19 | iVar21 * 0x10 + (uint)(byte)local_188 * 4) ^ 4);
            *(short *)dst = (short)iVar21;
            *(char *)((long)dst + 2) = (char)((uint)iVar21 >> 0x10);
          }
          pbVar34 = (byte *)(uVar15 + uVar33);
          goto LAB_0037858a;
        }
        memcpy(pZVar17,pZVar9,0x404);
        lVar30 = ((ulong)(0x1f < uVar25) + 1) - (ulong)(uVar25 < 0x1000);
        lVar16 = lVar30 + 1;
        if (lVar16 == 3) {
          *(uint *)dst = iVar21 << 4 | 0xd;
        }
        else if ((int)lVar16 == 2) {
          *(ushort *)dst = (ushort)(iVar21 << 4) | 5;
        }
        else {
          *(char *)dst = (char)uVar25 * '\b' + '\x01';
        }
        *(BYTE *)((long)dst + lVar16) = *pBVar10;
        pbVar34 = (byte *)(ulong)((int)lVar30 + 2);
        goto LAB_00378599;
      }
      pbVar34 = (byte *)0xffffffffffffffba;
    }
    else {
LAB_00378563:
      pbVar34 = (byte *)ZSTD_noCompressLiterals(dst,dstCapacity,pBVar10,uVar25);
LAB_0037858a:
      if (pbVar34 < (byte *)0xffffffffffffff89) {
LAB_00378599:
        if ((long)(dstCapacity - (long)pbVar34) < 4) {
          pbVar34 = (byte *)0xffffffffffffffba;
        }
        else {
          uVar25 = (long)psVar12 - (long)psVar11 >> 3;
          pbVar34 = pbVar34 + (long)dst;
          if (uVar25 < 0x7f) {
            *pbVar34 = (byte)uVar25;
            pbVar35 = pbVar34 + 1;
          }
          else if (uVar25 < 0x7f00) {
            *pbVar34 = (byte)(uVar25 >> 8) | 0x80;
            pbVar34[1] = (byte)uVar25;
            pbVar35 = pbVar34 + 2;
          }
          else {
            *pbVar34 = 0xff;
            *(short *)(pbVar34 + 1) = (short)uVar25 + -0x7f00;
            pbVar35 = pbVar34 + 3;
          }
          pZVar3 = &(pZVar17->entropy).fse;
          if (psVar12 == psVar11) {
            memcpy(pZVar3,&(pZVar9->entropy).fse,0xde0);
LAB_00378c59:
            pbVar34 = pbVar35 + -(long)dst;
            if (pbVar34 == (byte *)0x0) goto LAB_00378c80;
          }
          else {
            local_1a0 = (pZVar17->entropy).fse.litlengthCTable;
            puVar1 = (ulong *)(pbVar35 + 1);
            local_188 = pZVar3;
            ZSTD_seqToCodes(seqStore);
            max = 0x23;
            sVar37 = 0x378790;
            sVar31 = HIST_countFast_wksp(count,&max,local_178,uVar25,pUVar22,0x1800);
            (pZVar17->entropy).fse.litlength_repeatMode = (pZVar9->entropy).fse.litlength_repeatMode
            ;
            pFVar2 = (pZVar9->entropy).fse.litlengthCTable;
            sVar14 = ZSTD_selectEncodingType
                               (&(pZVar17->entropy).fse.litlength_repeatMode,count,max,sVar31,uVar25
                                ,9,pFVar2,LL_defaultNorm,6,ZSTD_defaultAllowed,ZVar7);
            pbVar34 = (byte *)ZSTD_buildCTable(puVar1,(long)dst + (dstCapacity - (long)puVar1),
                                               local_1a0,9,sVar14,count,max,local_178,uVar25,
                                               LL_defaultNorm,6,0x23,pFVar2,0x524,pUVar22,sVar37);
            if (pbVar34 < (byte *)0xffffffffffffff89) {
              puVar26 = (ulong *)(pbVar34 + (long)puVar1);
              local_170 = &(pZVar9->entropy).fse;
              max = 0x1f;
              sVar37 = 0x3788bb;
              local_190 = sVar14;
              sVar31 = HIST_countFast_wksp(count,&max,local_198,uVar25,pUVar22,0x1800);
              pZVar3 = local_170;
              (pZVar17->entropy).fse.offcode_repeatMode = (pZVar9->entropy).fse.offcode_repeatMode;
              sVar14 = ZSTD_selectEncodingType
                                 (&(pZVar17->entropy).fse.offcode_repeatMode,count,max,sVar31,uVar25
                                  ,8,local_170->offcodeCTable,OF_defaultNorm,5,(uint)(max < 0x1d),
                                  ZVar7);
              pbVar34 = (byte *)ZSTD_buildCTable(puVar26,(long)dst + (dstCapacity - (long)puVar26),
                                                 local_188->offcodeCTable,8,sVar14,count,max,
                                                 local_198,uVar25,OF_defaultNorm,5,0x1c,
                                                 pZVar3->offcodeCTable,0x304,pUVar22,sVar37);
              if (pbVar34 < (byte *)0xffffffffffffff89) {
                dst_00 = (ulong *)(pbVar34 + (long)puVar26);
                puVar32 = (ulong *)0x0;
                if (local_190 == set_compressed) {
                  puVar32 = puVar1;
                }
                if (sVar14 == set_compressed) {
                  puVar32 = puVar26;
                }
                pFVar2 = (pZVar17->entropy).fse.matchlengthCTable;
                _max = CONCAT44(uStack_1c4,0x34);
                sVar37 = 0x3789f2;
                local_170 = (ZSTD_fseCTables_t *)(ulong)sVar14;
                sVar31 = HIST_countFast_wksp(count,&max,local_180,uVar25,pUVar22,0x1800);
                (pZVar17->entropy).fse.matchlength_repeatMode =
                     (pZVar9->entropy).fse.matchlength_repeatMode;
                prevCTable = (pZVar9->entropy).fse.matchlengthCTable;
                sVar14 = ZSTD_selectEncodingType
                                   (&(pZVar17->entropy).fse.matchlength_repeatMode,count,max,sVar31,
                                    uVar25,9,prevCTable,ML_defaultNorm,6,ZSTD_defaultAllowed,ZVar7);
                pbVar34 = (byte *)ZSTD_buildCTable(dst_00,(long)dst + (dstCapacity - (long)dst_00),
                                                   pFVar2,9,sVar14,count,(U32)_max,local_180,uVar25,
                                                   ML_defaultNorm,6,0x34,prevCTable,0x5ac,pUVar22,
                                                   sVar37);
                pBVar10 = local_180;
                puVar1 = (ulong *)(pbVar34 + (long)dst_00);
                puVar27 = dst_00;
                puVar26 = puVar32;
                if (pbVar34 < (byte *)0xffffffffffffff89) {
                  puVar27 = puVar1;
                  puVar26 = dst_00;
                }
                if (sVar14 != set_compressed) {
                  puVar26 = puVar32;
                }
                if (pbVar34 < (byte *)0xffffffffffffff89) {
                  *pbVar35 = (char)((int)local_170 << 4) + (char)(local_190 << 6) +
                             (char)sVar14 * '\x04';
                  puVar32 = (ulong *)((long)dst + (dstCapacity - 8));
                  if (8 < (long)dst + (dstCapacity - (long)puVar1)) {
                    local_1b8 = puVar1;
                    local_1a8 = puVar32;
                    FSE_initCState2(&stateMatchLength,pFVar2,(uint)local_180[uVar25 - 1]);
                    pBVar24 = local_198;
                    FSE_initCState2(&stateOffsetBits,local_188->offcodeCTable,
                                    (uint)local_198[uVar25 - 1]);
                    pBVar13 = local_178;
                    FSE_initCState2(&local_168,local_1a0,(uint)local_178[uVar25 - 1]);
                    local_1c0 = LL_bits[pBVar13[uVar25 - 1]];
                    _max = (ulong)((uint)psVar11[uVar25 - 1].matchLength &
                                  BIT_mask[ML_bits[pBVar10[uVar25 - 1]]]) <<
                           ((byte)local_1c0 & 0x3f) |
                           (ulong)((uint)psVar11[uVar25 - 1].litLength & BIT_mask[local_1c0]);
                    local_1c0 = ML_bits[pBVar10[uVar25 - 1]] + local_1c0;
                    local_1b0 = puVar1;
                    if (local_18c < 0x3a) {
                      _max = (ulong)(BIT_mask[pBVar24[uVar25 - 1]] & psVar11[uVar25 - 1].offset) <<
                             ((byte)local_1c0 & 0x3f) | _max;
                      local_1c0 = local_1c0 + pBVar24[uVar25 - 1];
                    }
                    else {
                      uVar19 = (uint)pBVar24[uVar25 - 1];
                      if (uVar19 < 0x38) {
                        uVar28 = psVar11[uVar25 - 1].offset;
                        bVar18 = 0;
                      }
                      else {
                        uVar33 = 0;
                        uVar28 = psVar11[uVar25 - 1].offset;
                        if (uVar19 != 0x38) {
                          uVar33 = (ulong)(uVar19 - 0x38);
                          _max = (ulong)(BIT_mask[uVar33] & uVar28) << ((byte)local_1c0 & 0x3f) |
                                 _max;
                          local_1c0 = (uVar19 + local_1c0) - 0x38;
                          local_1b0 = (ulong *)((ulong)(local_1c0 >> 3) + (long)puVar1);
                          if (puVar32 < local_1b0) {
                            local_1b0 = puVar32;
                          }
                          *puVar1 = _max;
                          _max = _max >> ((byte)local_1c0 & 0x38);
                          local_1c0 = local_1c0 & 7;
                        }
                        bVar18 = (byte)uVar33;
                        uVar19 = 0x38;
                      }
                      _max = (ulong)(uVar28 >> (bVar18 & 0x1f) & BIT_mask[uVar19]) <<
                             ((byte)local_1c0 & 0x3f) | _max;
                      local_1c0 = uVar19 + local_1c0;
                    }
                    *local_1b0 = _max;
                    local_1b0 = (ulong *)((ulong)(local_1c0 >> 3) + (long)local_1b0);
                    if (puVar32 < local_1b0) {
                      local_1b0 = puVar32;
                    }
                    _max = _max >> ((byte)local_1c0 & 0x38);
                    for (uVar33 = uVar25 - 2; local_1c0 = local_1c0 & 7, uVar33 < uVar25;
                        uVar33 = uVar33 - 1) {
                      bVar18 = local_178[uVar33];
                      bVar4 = pBVar24[uVar33];
                      symbol = (uint)bVar4;
                      bVar5 = local_180[uVar33];
                      uVar19 = LL_bits[bVar18];
                      uVar28 = ML_bits[bVar5];
                      FSE_encodeSymbol((BIT_CStream_t *)&max,&stateOffsetBits,symbol);
                      FSE_encodeSymbol((BIT_CStream_t *)&max,&stateMatchLength,(uint)bVar5);
                      FSE_encodeSymbol((BIT_CStream_t *)&max,&local_168,(uint)bVar18);
                      uVar23 = uVar28 + uVar19 + bVar4;
                      uVar29 = local_1c0;
                      if (0x1e < uVar23) {
                        *local_1b0 = _max;
                        local_1b0 = (ulong *)((ulong)(local_1c0 >> 3) + (long)local_1b0);
                        if (local_1a8 < local_1b0) {
                          local_1b0 = local_1a8;
                        }
                        uVar29 = local_1c0 & 7;
                        _max = _max >> ((byte)local_1c0 & 0x38);
                      }
                      _max = (ulong)((uint)psVar11[uVar33].matchLength & BIT_mask[uVar28]) <<
                             ((byte)(uVar29 + uVar19) & 0x3f) |
                             (ulong)((uint)psVar11[uVar33].litLength & BIT_mask[uVar19]) <<
                             ((byte)uVar29 & 0x3f) | _max;
                      uVar28 = uVar28 + uVar29 + uVar19;
                      local_1c0 = uVar28;
                      if (0x38 < uVar23) {
                        *local_1b0 = _max;
                        local_1b0 = (ulong *)((ulong)(uVar28 >> 3) + (long)local_1b0);
                        if (local_1a8 < local_1b0) {
                          local_1b0 = local_1a8;
                        }
                        local_1c0 = uVar28 & 7;
                        _max = _max >> ((byte)uVar28 & 0x38);
                      }
                      if (local_18c < 0x3a) {
                        _max = (ulong)(BIT_mask[symbol] & psVar11[uVar33].offset) <<
                               ((byte)local_1c0 & 0x3f) | _max;
                        local_1c0 = local_1c0 + symbol;
                      }
                      else {
                        if (bVar4 < 0x38) {
                          uVar19 = psVar11[uVar33].offset;
                          bVar18 = 0;
                        }
                        else {
                          uVar15 = 0;
                          uVar19 = psVar11[uVar33].offset;
                          if (bVar4 != 0x38) {
                            uVar15 = (ulong)(symbol - 0x38);
                            _max = (ulong)(BIT_mask[uVar15] & uVar19) << ((byte)local_1c0 & 0x3f) |
                                   _max;
                            local_1c0 = (local_1c0 + symbol) - 0x38;
                            *local_1b0 = _max;
                            local_1b0 = (ulong *)((ulong)(local_1c0 >> 3) + (long)local_1b0);
                            if (local_1a8 < local_1b0) {
                              local_1b0 = local_1a8;
                            }
                            _max = _max >> ((byte)local_1c0 & 0x38);
                            local_1c0 = local_1c0 & 7;
                          }
                          bVar18 = (byte)uVar15;
                          symbol = 0x38;
                        }
                        _max = (ulong)(uVar19 >> (bVar18 & 0x1f) & BIT_mask[symbol]) <<
                               ((byte)local_1c0 & 0x3f) | _max;
                        local_1c0 = symbol + local_1c0;
                      }
                      *local_1b0 = _max;
                      local_1b0 = (ulong *)((ulong)(local_1c0 >> 3) + (long)local_1b0);
                      if (local_1a8 < local_1b0) {
                        local_1b0 = local_1a8;
                      }
                      _max = _max >> ((byte)local_1c0 & 0x38);
                      pBVar24 = local_198;
                    }
                    FSE_flushCState((BIT_CStream_t *)&max,&stateMatchLength);
                    FSE_flushCState((BIT_CStream_t *)&max,&stateOffsetBits);
                    FSE_flushCState((BIT_CStream_t *)&max,&local_168);
                    *local_1b0 = _max | 1L << ((ulong)local_1c0 & 0x3f);
                    local_1b0 = (ulong *)((ulong)(local_1c0 + 1 >> 3) + (long)local_1b0);
                    if (local_1a8 < local_1b0) {
                      local_1b0 = local_1a8;
                    }
                    if ((local_1b0 < local_1a8) &&
                       (pbVar34 = (byte *)((long)local_1b0 +
                                          ((ulong)((local_1c0 + 1 & 7) != 0) - (long)local_1b8)),
                       pbVar34 != (byte *)0x0)) {
                      if (pbVar34 < (byte *)0xffffffffffffff89) {
                        pbVar35 = (byte *)((long)puVar27 + (long)pbVar34);
                        if ((puVar26 != (ulong *)0x0) && ((long)pbVar35 - (long)puVar26 < 4))
                        goto LAB_00378c80;
                        goto LAB_00378c59;
                      }
                      goto LAB_00378c75;
                    }
                  }
                  pbVar34 = (byte *)0xffffffffffffffba;
                }
              }
            }
          }
        }
      }
    }
LAB_00378c75:
    if ((dstCapacity < srcSize) || (pbVar34 != (byte *)0xffffffffffffffba)) {
      if (pbVar34 < (byte *)0xffffffffffffff89) {
        ZVar7 = (zc->appliedParams).cParams.strategy;
        bVar18 = 6;
        if (ZSTD_btopt < ZVar7) {
          bVar18 = (char)ZVar7 - 1;
        }
        if ((byte *)((srcSize - (srcSize >> (bVar18 & 0x3f))) + -2) <= pbVar34) {
          pbVar34 = (byte *)0x0;
        }
      }
      pZVar9 = (zc->blockState).prevCBlock;
      pZVar17 = pZVar9;
      if (pbVar34 + -1 < (byte *)0xffffffffffffff88) {
        pZVar17 = (zc->blockState).nextCBlock;
        (zc->blockState).prevCBlock = pZVar17;
        (zc->blockState).nextCBlock = pZVar9;
      }
      goto LAB_00378c8a;
    }
  }
LAB_00378c80:
  pbVar34 = (byte *)0x0;
  pZVar17 = (zc->blockState).prevCBlock;
LAB_00378c8a:
  if ((pZVar17->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
    (pZVar17->entropy).fse.offcode_repeatMode = FSE_repeat_check;
  }
  return (size_t)pbVar34;
}

Assistant:

static size_t ZSTD_compressBlock_internal(ZSTD_CCtx* zc,
                                        void* dst, size_t dstCapacity,
                                        const void* src, size_t srcSize)
{
    ZSTD_matchState_t* const ms = &zc->blockState.matchState;
    size_t cSize;
    DEBUGLOG(5, "ZSTD_compressBlock_internal (dstCapacity=%u, dictLimit=%u, nextToUpdate=%u)",
                (unsigned)dstCapacity, (unsigned)ms->window.dictLimit, (unsigned)ms->nextToUpdate);
    assert(srcSize <= ZSTD_BLOCKSIZE_MAX);

    /* Assert that we have correctly flushed the ctx params into the ms's copy */
    ZSTD_assertEqualCParams(zc->appliedParams.cParams, ms->cParams);

    if (srcSize < MIN_CBLOCK_SIZE+ZSTD_blockHeaderSize+1) {
        ZSTD_ldm_skipSequences(&zc->externSeqStore, srcSize, zc->appliedParams.cParams.minMatch);
        cSize = 0;
        goto out;  /* don't even attempt compression below a certain srcSize */
    }
    ZSTD_resetSeqStore(&(zc->seqStore));
    ms->opt.symbolCosts = &zc->blockState.prevCBlock->entropy;   /* required for optimal parser to read stats from dictionary */

    /* a gap between an attached dict and the current window is not safe,
     * they must remain adjacent,
     * and when that stops being the case, the dict must be unset */
    assert(ms->dictMatchState == NULL || ms->loadedDictEnd == ms->window.dictLimit);

    /* limited update after a very long match */
    {   const BYTE* const base = ms->window.base;
        const BYTE* const istart = (const BYTE*)src;
        const U32 current = (U32)(istart-base);
        if (sizeof(ptrdiff_t)==8) assert(istart - base < (ptrdiff_t)(U32)(-1));   /* ensure no overflow */
        if (current > ms->nextToUpdate + 384)
            ms->nextToUpdate = current - MIN(192, (U32)(current - ms->nextToUpdate - 384));
    }

    /* select and store sequences */
    {   ZSTD_dictMode_e const dictMode = ZSTD_matchState_dictMode(ms);
        size_t lastLLSize;
        {   int i;
            for (i = 0; i < ZSTD_REP_NUM; ++i)
                zc->blockState.nextCBlock->rep[i] = zc->blockState.prevCBlock->rep[i];
        }
        if (zc->externSeqStore.pos < zc->externSeqStore.size) {
            assert(!zc->appliedParams.ldmParams.enableLdm);
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&zc->externSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       src, srcSize);
            assert(zc->externSeqStore.pos <= zc->externSeqStore.size);
        } else if (zc->appliedParams.ldmParams.enableLdm) {
            rawSeqStore_t ldmSeqStore = {NULL, 0, 0, 0};

            ldmSeqStore.seq = zc->ldmSequences;
            ldmSeqStore.capacity = zc->maxNbLdmSequences;
            /* Updates ldmSeqStore.size */
            CHECK_F(ZSTD_ldm_generateSequences(&zc->ldmState, &ldmSeqStore,
                                               &zc->appliedParams.ldmParams,
                                               src, srcSize));
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&ldmSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       src, srcSize);
            assert(ldmSeqStore.pos == ldmSeqStore.size);
        } else {   /* not long range mode */
            ZSTD_blockCompressor const blockCompressor = ZSTD_selectBlockCompressor(zc->appliedParams.cParams.strategy, dictMode);
            lastLLSize = blockCompressor(ms, &zc->seqStore, zc->blockState.nextCBlock->rep, src, srcSize);
        }
        {   const BYTE* const lastLiterals = (const BYTE*)src + srcSize - lastLLSize;
            ZSTD_storeLastLiterals(&zc->seqStore, lastLiterals, lastLLSize);
    }   }

    /* encode sequences and literals */
    cSize = ZSTD_compressSequences(&zc->seqStore,
            &zc->blockState.prevCBlock->entropy, &zc->blockState.nextCBlock->entropy,
            &zc->appliedParams,
            dst, dstCapacity,
            srcSize,
            zc->entropyWorkspace, HUF_WORKSPACE_SIZE /* statically allocated in resetCCtx */,
            zc->bmi2);

out:
    if (!ZSTD_isError(cSize) && cSize != 0) {
        /* confirm repcodes and entropy tables when emitting a compressed block */
        ZSTD_compressedBlockState_t* const tmp = zc->blockState.prevCBlock;
        zc->blockState.prevCBlock = zc->blockState.nextCBlock;
        zc->blockState.nextCBlock = tmp;
    }
    /* We check that dictionaries have offset codes available for the first
     * block. After the first block, the offcode table might not have large
     * enough codes to represent the offsets in the data.
     */
    if (zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode == FSE_repeat_valid)
        zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode = FSE_repeat_check;

    return cSize;
}